

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void __thiscall TC_parser<false>::listFeatures(TC_parser<false> *this)

{
  long in_RDI;
  bool bVar1;
  char *in_stack_000000c0;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  char *in_stack_000000d8;
  TC_parser<false> *in_stack_000000e0;
  TC_parser<false> *in_stack_000000f0;
  
  while( true ) {
    if ((**(char **)(in_RDI + 8) == ' ') || (bVar1 = false, **(char **)(in_RDI + 8) == '\t')) {
      bVar1 = *(ulong *)(in_RDI + 8) < *(ulong *)(in_RDI + 0x10);
    }
    if (!bVar1) break;
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    maybeFeature(in_stack_000000f0);
  }
  if (((**(char **)(in_RDI + 8) != '|') && (*(long *)(in_RDI + 8) != *(long *)(in_RDI + 0x10))) &&
     (**(char **)(in_RDI + 8) != '\r')) {
    parserWarning(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                  in_stack_000000c0);
  }
  return;
}

Assistant:

inline void listFeatures()
  {
    while ((*reading_head == ' ' || *reading_head == '\t') && (reading_head < endLine))
    {
      // listFeatures --> ' ' MaybeFeature ListFeatures
      ++reading_head;
      maybeFeature();
    }
    if (!(*reading_head == '|' || reading_head == endLine || *reading_head == '\r'))
    {
      // syntax error
      parserWarning("malformed example! '|',space, or EOL expected after : \"", beginLine, reading_head, "\"");
    }
  }